

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBlock(WasmBytecodeGenerator *this)

{
  uint label;
  WasmBinaryReader *pWVar1;
  BlockInfo *blockInfo;
  PolymorphicEmitInfo PVar2;
  
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  pWVar1 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar1 == (WasmBinaryReader *)0x0) {
    pWVar1 = (this->m_module->m_reader).ptr;
  }
  blockInfo = PushLabel(this,(pWVar1->super_WasmReaderBase).m_currentNode.field_1.block,label,true,
                        true);
  EmitBlockCommon(this,blockInfo,(bool *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar2 = PopLabel(this,label);
  return PVar2;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBlock()
{
    Js::ByteCodeLabel blockLabel = m_writer->DefineLabel();

    BlockInfo* blockInfo = PushLabel(GetReader()->m_currentNode.block, blockLabel);
    EmitBlockCommon(blockInfo);
    m_writer->MarkAsmJsLabel(blockLabel);
    PolymorphicEmitInfo yieldInfo = PopLabel(blockLabel);

    // block yields last value
    return yieldInfo;
}